

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bsreada(bstring r,bStream *s,int n)

{
  bstring ptVar1;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  int iVar7;
  tagbstring x;
  tagbstring local_40;
  
  iVar4 = -1;
  if ((((s != (bStream *)0x0) && (ptVar1 = s->buff, r != (bstring)0x0 && ptVar1 != (bstring)0x0)) &&
      (0 < r->mlen)) && ((iVar6 = r->slen, -1 < iVar6 && (0 < n && iVar6 <= r->mlen)))) {
    iVar7 = ptVar1->slen;
    iVar3 = balloc(ptVar1,s->maxBuffSz + 1);
    if (iVar3 == 0) {
      iVar6 = iVar6 + n;
      puVar2 = s->buff->data;
      local_40.data = puVar2;
      do {
        if (iVar6 <= r->slen + iVar7) {
          local_40.slen = iVar6 - r->slen;
          iVar4 = bconcat(r,&local_40);
          ptVar1 = s->buff;
          ptVar1->slen = iVar7;
          if (iVar4 == 0) {
            bdelete(ptVar1,0,local_40.slen);
          }
          goto LAB_0011c8d5;
        }
        local_40.slen = iVar7;
        iVar4 = bconcat(r,&local_40);
        if (iVar4 != 0) break;
        iVar4 = iVar6 - r->slen;
        if (s->maxBuffSz <= iVar4) {
          iVar4 = s->maxBuffSz;
        }
        sVar5 = (*s->readFnPtr)(puVar2,1,(long)iVar4,s->parm);
        iVar7 = (int)sVar5;
      } while (0 < iVar7);
      if (iVar7 < 1) {
        s->isEOF = 1;
        iVar7 = 0;
      }
      s->buff->slen = iVar7;
LAB_0011c8d5:
      iVar4 = -(uint)(r->slen == 0);
    }
  }
  return iVar4;
}

Assistant:

int bsreada (bstring r, struct bStream * s, int n) {
int l, ret;
char * b;
struct tagbstring x;

	if (s == NULL || s->buff == NULL || r == NULL || r->mlen <= 0
	 || r->slen < 0 || r->mlen < r->slen || n <= 0) return BSTR_ERR;

	n += r->slen;
	if (n <= 0) return BSTR_ERR;

	l = s->buff->slen;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	b = (char *) s->buff->data;
	x.data = (unsigned char *) b;

	do {
		if (l + r->slen >= n) {
			x.slen = n - r->slen;
			ret = bconcat (r, &x);
			s->buff->slen = l;
			if (BSTR_OK == ret) bdelete (s->buff, 0, x.slen);
			return BSTR_ERR & -(r->slen == 0);
		}

		x.slen = l;
		if (BSTR_OK != bconcat (r, &x)) break;

		l = n - r->slen;
		if (l > s->maxBuffSz) l = s->maxBuffSz;

		l = (int) s->readFnPtr (b, 1, l, s->parm);

	} while (l > 0);
	if (l < 0) l = 0;
	if (l == 0) s->isEOF = 1;
	s->buff->slen = l;
	return BSTR_ERR & -(r->slen == 0);
}